

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O2

int ffibin(fitsfile *fptr,LONGLONG naxis2,int tfields,char **ttype,char **tform,char **tunit,
          char *extnmx,LONGLONG pcount,int *status)

{
  int iVar1;
  LONGLONG LVar2;
  LONGLONG *pLVar3;
  fitsfile *fptr_00;
  int iVar4;
  int iVar5;
  FITSfile *pFVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  int datacode;
  char **local_100;
  char **local_f8;
  ulong local_f0;
  fitsfile *local_e8;
  long width;
  char extnm [71];
  long repeat;
  
  iVar4 = *status;
  if (iVar4 < 1) {
    extnm[0] = '\0';
    if (extnmx != (char *)0x0) {
      strncat(extnm,extnmx,0x46);
    }
    iVar4 = fptr->HDUposition;
    pFVar6 = fptr->Fptr;
    if (iVar4 != pFVar6->curhdu) {
      ffmahd(fptr,iVar4 + 1,(int *)0x0,status);
      pFVar6 = fptr->Fptr;
      iVar4 = pFVar6->curhdu;
    }
    if ((pFVar6->headend == pFVar6->headstart[iVar4]) ||
       ((iVar4 == pFVar6->maxhdu && (pFVar6->logfilesize <= pFVar6->headstart[(long)iVar4 + 1])))) {
      ffcrtb(fptr,2,naxis2,tfields,ttype,tform,tunit,extnm,status);
      iVar4 = *status;
    }
    else if (naxis2 < 0) {
      *status = 0xda;
      iVar4 = 0xda;
    }
    else if ((uint)tfields < 1000) {
      iVar4 = 0;
      for (uVar8 = 0; (uint)tfields != uVar8; uVar8 = uVar8 + 1) {
        if ((tunit != (char **)0x0) && (*tunit != (char *)0x0)) {
          iVar4 = (iVar4 + 1) - (uint)(*tunit[uVar8] == '\0');
        }
      }
      bVar11 = extnm[0] == '\0';
      lVar10 = 0;
      local_100 = tform;
      local_f8 = ttype;
      local_f0 = (ulong)(uint)tfields;
      local_e8 = fptr;
      for (uVar8 = 0; fptr_00 = local_e8, (uint)tfields != uVar8; uVar8 = uVar8 + 1) {
        ffbnfm(local_100[uVar8],&datacode,&repeat,&width,status);
        lVar7 = repeat;
        if (datacode != 0x10) {
          if (datacode == 1) {
            lVar7 = (repeat + 7) / 8;
          }
          else {
            lVar7 = repeat * width;
          }
        }
        lVar10 = lVar10 + lVar7;
      }
      iVar4 = (int)(((iVar4 + tfields * 2) - (uint)bVar11) + 0x2d) / 0x24;
      if (local_e8->Fptr->writemode == 1) {
        ffrdef(local_e8,status);
        ffpdfl(fptr_00,status);
        pFVar6 = fptr_00->Fptr;
        iVar1 = pFVar6->curhdu;
        LVar2 = pFVar6->headstart[(long)iVar1 + 1];
        pFVar6->hdutype = 2;
        iVar5 = ffiblk(fptr_00,(long)iVar4 + (pcount + lVar10 * naxis2 + 0xb3f) / 0xb40,1,status);
        if (iVar5 < 1) {
          pFVar6 = fptr_00->Fptr;
          iVar9 = pFVar6->maxhdu + 1;
          pFVar6->maxhdu = iVar9;
          iVar5 = pFVar6->curhdu;
          pLVar3 = pFVar6->headstart;
          for (lVar10 = (long)iVar9; iVar5 < lVar10; lVar10 = lVar10 + -1) {
            pLVar3[lVar10 + 1] = pLVar3[lVar10];
          }
          pLVar3[(long)iVar1 + 1] = LVar2;
          pFVar6->curhdu = iVar1 + 1;
          fptr_00->HDUposition = iVar1 + 1;
          pFVar6->nextkey = LVar2;
          lVar10 = pLVar3[(long)iVar1 + 1];
          pFVar6->headend = lVar10;
          pFVar6->datastart = iVar4 * 0xb40 + lVar10;
          pFVar6->hdutype = 2;
          ffphbn(fptr_00,naxis2,(int)local_f0,local_f8,local_100,tunit,extnm,pcount,status);
          ffrdef(fptr_00,status);
        }
        iVar4 = *status;
      }
      else {
        *status = 0x70;
        iVar4 = 0x70;
      }
    }
    else {
      snprintf((char *)&repeat,0x51,"Illegal value for TFIELDS keyword: %d",(ulong)(uint)tfields);
      ffpmsg((char *)&repeat);
      *status = 0xd8;
      iVar4 = 0xd8;
    }
  }
  return iVar4;
}

Assistant:

int ffibin(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,     /* I - value of EXTNAME keyword, if any         */
           LONGLONG pcount, /* I - size of special data area (heap)         */
           int *status)     /* IO - error status                            */
/*
  insert a Binary table extension following the current HDU 
*/
{
    int nexthdu, maxhdu, ii, nunit, nhead, datacode;
    LONGLONG naxis1;
    long nblocks, repeat, width;
    LONGLONG datasize, newstart;
    char errmsg[FLEN_ERRMSG], extnm[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    extnm[0] = '\0';
    if (extnmx)
      strncat(extnm, extnmx, FLEN_VALUE-1);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    maxhdu = (fptr->Fptr)->maxhdu;
    /* if the current header is completely empty ...  */
    if (( (fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        /* or, if we are at the end of the file, ... */
    ||  ( (((fptr->Fptr)->curhdu) == maxhdu ) &&
       ((fptr->Fptr)->headstart[maxhdu + 1] >= (fptr->Fptr)->logfilesize ) ) )
    {
        /* then simply append new image extension */
        ffcrtb(fptr, BINARY_TBL, naxis2, tfields, ttype, tform, tunit,
               extnm, status);
        return(*status);
    }

    if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (tfields < 0 || tfields > 999)
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for TFIELDS keyword: %d", tfields);
        ffpmsg(errmsg);
        return(*status = BAD_TFIELDS);
    }

    /* count number of optional TUNIT keywords to be written */
    nunit = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        if (tunit && *tunit && *tunit[ii])
            nunit++;
    }

    if (*extnm)
         nunit++;     /* add one for the EXTNAME keyword */

    nhead = (9 + (2 * tfields) + nunit + 35) / 36;  /* no. of header blocks */

    /* calculate total width of the table */
    naxis1 = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        ffbnfm(tform[ii], &datacode, &repeat, &width, status);

        if (datacode == TBIT)
            naxis1 = naxis1 + ((repeat + 7) / 8);
        else if (datacode == TSTRING)
            naxis1 += repeat;
        else
            naxis1 = naxis1 + (repeat * width);
    }

    datasize = ((LONGLONG)naxis1 * naxis2) + pcount;         /* size of table in bytes */
    nblocks = (long) ((datasize + 2879) / 2880) + nhead;  /* size of HDU */

    if ((fptr->Fptr)->writemode == READWRITE) /* must have write access */
    {   /* close the CHDU */
        ffrdef(fptr, status);  /* scan header to redefine structure */
        ffpdfl(fptr, status);  /* insure correct data file values */
    }
    else
        return(*status = READONLY_FILE);

    nexthdu = ((fptr->Fptr)->curhdu) + 1; /* number of the next (new) hdu */
    newstart = (fptr->Fptr)->headstart[nexthdu]; /* save starting addr of HDU */

    (fptr->Fptr)->hdutype = BINARY_TBL;  /* so that correct fill value is used */

    /* ffiblk also increments headstart for all following HDUs */
    if (ffiblk(fptr, nblocks, 1, status) > 0)  /* insert the blocks */
        return(*status);

    ((fptr->Fptr)->maxhdu)++;      /* increment known number of HDUs in the file */
    for (ii = (fptr->Fptr)->maxhdu; ii > (fptr->Fptr)->curhdu; ii--)
        (fptr->Fptr)->headstart[ii + 1] = (fptr->Fptr)->headstart[ii]; /* incre start addr */

    (fptr->Fptr)->headstart[nexthdu] = newstart; /* set starting addr of HDU */

    /* set default parameters for this new empty HDU */
    (fptr->Fptr)->curhdu = nexthdu;   /* we are now located at the next HDU */
    fptr->HDUposition = nexthdu;      /* we are now located at the next HDU */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[nexthdu];  
    (fptr->Fptr)->headend = (fptr->Fptr)->headstart[nexthdu];
    (fptr->Fptr)->datastart = ((fptr->Fptr)->headstart[nexthdu]) + (nhead * 2880);
    (fptr->Fptr)->hdutype = BINARY_TBL;  /* might need to be reset... */

    /* write the required header keywords. This will write PCOUNT = 0 */
    /* so that the variable length data will be written at the right place */
    ffphbn(fptr, naxis2, tfields, ttype, tform, tunit, extnm, pcount,
           status);

    /* redefine internal structure for this HDU (with PCOUNT = 0) */
    ffrdef(fptr, status);

    return(*status);
}